

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

bool duckdb::Prefix::Traverse
               (ART *art,reference<Node> *l_node,reference<Node> *r_node,idx_t *pos,
               GateStatus status)

{
  byte bVar1;
  Node *pNVar2;
  bool bVar3;
  idx_t iVar4;
  byte bVar5;
  Prefix r_prefix;
  Node r_child;
  Prefix l_prefix;
  
  Prefix(&l_prefix,art,(Node)(l_node->_M_data->super_IndexPointer).data,true,false);
  Prefix(&r_prefix,art,(Node)(r_node->_M_data->super_IndexPointer).data,true,false);
  bVar1 = art->prefix_count;
  bVar5 = r_prefix.data[bVar1];
  if (l_prefix.data[bVar1] < r_prefix.data[bVar1]) {
    bVar5 = l_prefix.data[bVar1];
  }
  iVar4 = GetMismatchWithOther(&l_prefix,&r_prefix,(ulong)bVar5);
  *pos = iVar4;
  bVar3 = true;
  if (iVar4 == 0xffffffffffffffff) {
    if (l_prefix.data[bVar1] == r_prefix.data[bVar1]) {
      r_child = (Node)((r_prefix.ptr)->super_IndexPointer).data;
      ((r_prefix.ptr)->super_IndexPointer).data = 0;
      Node::Free(art,r_node->_M_data);
      bVar3 = Node::MergeInternal(l_prefix.ptr,art,&r_child,status);
    }
    else {
      *pos = (ulong)bVar5;
      if (((((r_prefix.ptr)->super_IndexPointer).data & 0x7f00000000000000) == 0x100000000000000) ||
         (r_prefix.data[bVar1] != bVar5)) {
        l_node->_M_data = l_prefix.ptr;
      }
      else {
        pNVar2 = r_node->_M_data;
        iVar4 = (l_node->_M_data->super_IndexPointer).data;
        (l_node->_M_data->super_IndexPointer).data = (pNVar2->super_IndexPointer).data;
        (pNVar2->super_IndexPointer).data = iVar4;
        l_node->_M_data = r_prefix.ptr;
      }
    }
  }
  return bVar3;
}

Assistant:

bool Prefix::Traverse(ART &art, reference<Node> &l_node, reference<Node> &r_node, idx_t &pos, const GateStatus status) {
	D_ASSERT(l_node.get().HasMetadata());
	D_ASSERT(r_node.get().HasMetadata());

	Prefix l_prefix(art, l_node, true);
	Prefix r_prefix(art, r_node, true);

	idx_t max_count = MinValue(l_prefix.data[Count(art)], r_prefix.data[Count(art)]);
	pos = GetMismatchWithOther(l_prefix, r_prefix, max_count);
	if (pos != DConstants::INVALID_INDEX) {
		return true;
	}

	// Match.
	if (l_prefix.data[Count(art)] == r_prefix.data[Count(art)]) {
		auto r_child = *r_prefix.ptr;
		r_prefix.ptr->Clear();
		Node::Free(art, r_node);
		return l_prefix.ptr->MergeInternal(art, r_child, status);
	}

	pos = max_count;
	if (r_prefix.ptr->GetType() != PREFIX && r_prefix.data[Count(art)] == max_count) {
		// l_prefix contains r_prefix.
		swap(l_node.get(), r_node.get());
		l_node = *r_prefix.ptr;
		return true;
	}
	// r_prefix contains l_prefix.
	l_node = *l_prefix.ptr;
	return true;
}